

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall common_log_entry::print(common_log_entry *this,FILE *file)

{
  value_type pcVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  reference ppcVar6;
  char *pcVar7;
  FILE *in_RSI;
  int *in_RDI;
  FILE *fcur;
  FILE *local_18;
  
  local_18 = in_RSI;
  if (in_RSI == (FILE *)0x0) {
    if ((*in_RDI == 1) && (common_log_verbosity_thold < 1)) {
      return;
    }
    local_18 = _stdout;
    if (*in_RDI != 0) {
      local_18 = _stderr;
    }
  }
  if (((*in_RDI != 0) && (*in_RDI != 5)) && ((*(byte *)(in_RDI + 1) & 1) != 0)) {
    if (*(long *)(in_RDI + 2) != 0) {
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,5);
      pcVar1 = *ppcVar6;
      lVar2 = *(long *)(in_RDI + 2);
      lVar3 = *(long *)(in_RDI + 2);
      lVar4 = *(long *)(in_RDI + 2);
      lVar5 = *(long *)(in_RDI + 2);
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,0);
      fprintf(local_18,"%s%d.%02d.%03d.%03d%s ",pcVar1,lVar2 / 60000000 & 0xffffffff,
              (lVar3 / 1000000) % 0x3c & 0xffffffff,(lVar4 / 1000) % 1000 & 0xffffffff,
              (int)(lVar5 % 1000),*ppcVar6);
    }
    switch(*in_RDI) {
    case 1:
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,4);
      fprintf(local_18,"%sD %s",*ppcVar6,"");
      break;
    case 2:
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,3);
      pcVar1 = *ppcVar6;
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,0);
      fprintf(local_18,"%sI %s",pcVar1,*ppcVar6);
      break;
    case 3:
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,6);
      fprintf(local_18,"%sW %s",*ppcVar6,"");
      break;
    case 4:
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,2);
      fprintf(local_18,"%sE %s",*ppcVar6,"");
    }
  }
  pcVar7 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1cd1c2);
  fprintf(local_18,"%s",pcVar7);
  if (((*in_RDI == 3) || (*in_RDI == 4)) || (*in_RDI == 1)) {
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](&g_col,0);
    fprintf(local_18,"%s",*ppcVar6);
  }
  fflush(local_18);
  return;
}

Assistant:

void print(FILE * file = nullptr) const {
        FILE * fcur = file;
        if (!fcur) {
            // stderr displays DBG messages only when their verbosity level is not higher than the threshold
            // these messages will still be logged to a file
            if (level == GGML_LOG_LEVEL_DEBUG && common_log_verbosity_thold < LOG_DEFAULT_DEBUG) {
                return;
            }

            fcur = stdout;

            if (level != GGML_LOG_LEVEL_NONE) {
                fcur = stderr;
            }
        }

        if (level != GGML_LOG_LEVEL_NONE && level != GGML_LOG_LEVEL_CONT && prefix) {
            if (timestamp) {
                // [M.s.ms.us]
                fprintf(fcur, "%s%d.%02d.%03d.%03d%s ",
                        g_col[COMMON_LOG_COL_BLUE],
                        (int) (timestamp / 1000000 / 60),
                        (int) (timestamp / 1000000 % 60),
                        (int) (timestamp / 1000 % 1000),
                        (int) (timestamp % 1000),
                        g_col[COMMON_LOG_COL_DEFAULT]);
            }

            switch (level) {
                case GGML_LOG_LEVEL_INFO:  fprintf(fcur, "%sI %s", g_col[COMMON_LOG_COL_GREEN],   g_col[COMMON_LOG_COL_DEFAULT]); break;
                case GGML_LOG_LEVEL_WARN:  fprintf(fcur, "%sW %s", g_col[COMMON_LOG_COL_MAGENTA], ""                        ); break;
                case GGML_LOG_LEVEL_ERROR: fprintf(fcur, "%sE %s", g_col[COMMON_LOG_COL_RED],     ""                        ); break;
                case GGML_LOG_LEVEL_DEBUG: fprintf(fcur, "%sD %s", g_col[COMMON_LOG_COL_YELLOW],  ""                        ); break;
                default:
                    break;
            }
        }

        fprintf(fcur, "%s", msg.data());

        if (level == GGML_LOG_LEVEL_WARN || level == GGML_LOG_LEVEL_ERROR || level == GGML_LOG_LEVEL_DEBUG) {
            fprintf(fcur, "%s", g_col[COMMON_LOG_COL_DEFAULT]);
        }

        fflush(fcur);
    }